

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     rcr<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  byte bVar2;
  undefined3 in_register_00000031;
  uint uVar3;
  bool bVar4;
  
  bVar4 = (context->flags).carry_ != 0;
  uVar3 = (uint)bVar4;
  (context->flags).overflow_ = (uint)(byte)(*destination >> 7 ^ bVar4);
  bVar2 = count + (char)((uint)(CONCAT31(in_register_00000031,count) * 0x39) >> 9) * -9;
  if (bVar2 != 0) {
    if (bVar2 == 8) {
      bVar2 = *destination * '\x02' | bVar4;
      uVar3 = (uint)(*destination & 0x80);
    }
    else {
      bVar1 = *destination;
      uVar3 = 1 << (bVar2 - 1 & 0x1f) & (uint)bVar1;
      bVar2 = bVar4 << (8 - bVar2 & 0x1f) | bVar1 << (9 - bVar2 & 0x1f) | bVar1 >> (bVar2 & 0x1f);
    }
    *destination = bVar2;
  }
  (context->flags).carry_ = uVar3;
  return;
}

Assistant:

IntT carry_bit() const { return carry_ ? 1 : 0; }